

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

ON_Mesh * __thiscall ON_Mesh::MeshPart(ON_Mesh *this,ON_MeshPart *mesh_part,ON_Mesh *mesh)

{
  int iVar1;
  int iVar2;
  ON_3fPointArray *this_00;
  ON_3fPoint *x;
  ON_3fVectorArray *pOVar3;
  ON_3fVector *pOVar4;
  ON_2fPointArray *this_01;
  ON_2fPoint *x_00;
  ON_SimpleArray<ON_Color> *this_02;
  ON_Color *x_01;
  ON_2dPointArray *this_03;
  ON_2dPoint *x_02;
  ON_SimpleArray<ON_SurfaceCurvature> *this_04;
  ON_SurfaceCurvature *x_03;
  bool *pbVar5;
  ON_MeshFace *pOVar6;
  ON_Mesh *local_a8;
  undefined1 local_8c [8];
  ON_MeshFace f;
  int fi;
  int fi1;
  int fi0;
  int bad_face_count;
  int iStack_64;
  bool bHidden;
  int vi;
  int vi1;
  int vi0;
  undefined1 local_49;
  ON_Mesh *local_48;
  ON_Mesh *local_40;
  ON_Mesh *submesh;
  bool bHasHiddenVertices;
  bool bHasPrincipalCurvatures;
  int iStack_30;
  bool bHasSurfaceParameters;
  bool bHasFaceNormals;
  bool bHasVertexColors;
  bool bHasTextureCoordinates;
  bool bHasVertexNormals;
  int submesh_F_count;
  int submesh_V_count;
  ON_Mesh *mesh_local;
  ON_MeshPart *mesh_part_local;
  ON_Mesh *this_local;
  
  _submesh_F_count = mesh;
  mesh_local = (ON_Mesh *)mesh_part;
  mesh_part_local = (ON_MeshPart *)this;
  if (this == mesh) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
               ,0x2dbf,"","ON_Mesh::MeshPart this == mesh");
    this_local = (ON_Mesh *)0x0;
  }
  else {
    if (mesh != (ON_Mesh *)0x0) {
      Destroy(mesh);
    }
    if (((*(int *)&(mesh_local->super_ON_Geometry).super_ON_Object.m_userdata_list < 0) ||
        (iVar2 = *(int *)((long)&(mesh_local->super_ON_Geometry).super_ON_Object.m_userdata_list + 4
                         ), iVar1 = ON_SimpleArray<ON_MeshFace>::Count(&this->m_F), iVar1 < iVar2))
       || (*(int *)((long)&(mesh_local->super_ON_Geometry).super_ON_Object.m_userdata_list + 4) <
           *(int *)&(mesh_local->super_ON_Geometry).super_ON_Object.m_userdata_list)) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
                 ,0x2dcb,"","ON_Mesh::MeshPart mesh_part.fi[] is not valid");
      this_local = (ON_Mesh *)0x0;
    }
    else if (((*(int *)&(mesh_local->super_ON_Geometry).super_ON_Object._vptr_ON_Object < 0) ||
             (iVar2 = *(int *)((long)&(mesh_local->super_ON_Geometry).super_ON_Object.
                                      _vptr_ON_Object + 4),
             iVar1 = ON_SimpleArray<ON_3fPoint>::Count
                               (&(this->m_V).super_ON_SimpleArray<ON_3fPoint>), iVar1 < iVar2)) ||
            (*(int *)((long)&(mesh_local->super_ON_Geometry).super_ON_Object._vptr_ON_Object + 4) <=
             *(int *)&(mesh_local->super_ON_Geometry).super_ON_Object._vptr_ON_Object)) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
                 ,0x2dd4,"","ON_Mesh::MeshPart mesh_part.vi[] is not valid");
      this_local = (ON_Mesh *)0x0;
    }
    else {
      _bHasFaceNormals =
           *(int *)((long)&(mesh_local->super_ON_Geometry).super_ON_Object._vptr_ON_Object + 4) -
           *(int *)&(mesh_local->super_ON_Geometry).super_ON_Object._vptr_ON_Object;
      iStack_30 = *(int *)((long)&(mesh_local->super_ON_Geometry).super_ON_Object.m_userdata_list +
                          4) -
                  *(int *)&(mesh_local->super_ON_Geometry).super_ON_Object.m_userdata_list;
      submesh._7_1_ = HasVertexNormals(this);
      submesh._6_1_ = HasTextureCoordinates(this);
      submesh._5_1_ = HasVertexColors(this);
      submesh._4_1_ = HasFaceNormals(this);
      submesh._3_1_ = HasSurfaceParameters(this);
      submesh._2_1_ = HasPrincipalCurvatures(this);
      iVar2 = HiddenVertexCount(this);
      submesh._1_1_ = 0 < iVar2;
      local_49 = 0;
      if (_submesh_F_count == (ON_Mesh *)0x0) {
        local_a8 = (ON_Mesh *)operator_new(0x6e0);
        local_49 = 1;
        local_48 = local_a8;
        ON_Mesh(local_a8,*(int *)((long)&(mesh_local->m_dV).super_ON_SimpleArray<ON_3dPoint>.
                                         _vptr_ON_SimpleArray + 4),
                *(int *)&(mesh_local->m_dV).super_ON_SimpleArray<ON_3dPoint>._vptr_ON_SimpleArray,
                (bool)(submesh._7_1_ & 1),(bool)(submesh._6_1_ & 1));
      }
      else {
        local_a8 = _submesh_F_count;
      }
      local_40 = local_a8;
      if ((submesh._5_1_ & 1) != 0) {
        ON_SimpleArray<ON_Color>::Reserve(&local_a8->m_C,(long)_bHasFaceNormals);
      }
      if ((submesh._3_1_ & 1) != 0) {
        ON_SimpleArray<ON_2dPoint>::Reserve
                  (&(local_40->m_S).super_ON_SimpleArray<ON_2dPoint>,(long)_bHasFaceNormals);
      }
      if ((submesh._2_1_ & 1) != 0) {
        ON_SimpleArray<ON_SurfaceCurvature>::Reserve(&local_40->m_K,(long)_bHasFaceNormals);
      }
      if ((submesh._1_1_ & 1) != 0) {
        ON_SimpleArray<bool>::Reserve(&local_40->m_H,(long)_bHasFaceNormals);
      }
      if ((submesh._4_1_ & 1) != 0) {
        ON_SimpleArray<ON_3fVector>::Reserve
                  (&(local_40->m_FN).super_ON_SimpleArray<ON_3fVector>,(long)iStack_30);
      }
      iStack_64 = *(int *)((long)&(mesh_local->super_ON_Geometry).super_ON_Object._vptr_ON_Object +
                          4);
      bad_face_count = *(int *)&(mesh_local->super_ON_Geometry).super_ON_Object._vptr_ON_Object;
      vi = bad_face_count;
      for (; bad_face_count < iStack_64; bad_face_count = bad_face_count + 1) {
        this_00 = &local_40->m_V;
        x = ON_SimpleArray<ON_3fPoint>::operator[]
                      (&(this->m_V).super_ON_SimpleArray<ON_3fPoint>,bad_face_count);
        ON_SimpleArray<ON_3fPoint>::Append(&this_00->super_ON_SimpleArray<ON_3fPoint>,x);
        if ((submesh._7_1_ & 1) != 0) {
          pOVar3 = &local_40->m_N;
          pOVar4 = ON_SimpleArray<ON_3fVector>::operator[]
                             (&(this->m_N).super_ON_SimpleArray<ON_3fVector>,bad_face_count);
          ON_SimpleArray<ON_3fVector>::Append(&pOVar3->super_ON_SimpleArray<ON_3fVector>,pOVar4);
        }
        if ((submesh._6_1_ & 1) != 0) {
          this_01 = &local_40->m_T;
          x_00 = ON_SimpleArray<ON_2fPoint>::operator[]
                           (&(this->m_T).super_ON_SimpleArray<ON_2fPoint>,bad_face_count);
          ON_SimpleArray<ON_2fPoint>::Append(&this_01->super_ON_SimpleArray<ON_2fPoint>,x_00);
        }
        if ((submesh._5_1_ & 1) != 0) {
          this_02 = &local_40->m_C;
          x_01 = ON_SimpleArray<ON_Color>::operator[](&this->m_C,bad_face_count);
          ON_SimpleArray<ON_Color>::Append(this_02,x_01);
        }
        if ((submesh._3_1_ & 1) != 0) {
          this_03 = &local_40->m_S;
          x_02 = ON_SimpleArray<ON_2dPoint>::operator[]
                           (&(this->m_S).super_ON_SimpleArray<ON_2dPoint>,bad_face_count);
          ON_SimpleArray<ON_2dPoint>::Append(&this_03->super_ON_SimpleArray<ON_2dPoint>,x_02);
        }
        if ((submesh._2_1_ & 1) != 0) {
          this_04 = &local_40->m_K;
          x_03 = ON_SimpleArray<ON_SurfaceCurvature>::operator[](&this->m_K,bad_face_count);
          ON_SimpleArray<ON_SurfaceCurvature>::Append(this_04,x_03);
        }
        if ((submesh._1_1_ & 1) != 0) {
          pbVar5 = ON_SimpleArray<bool>::operator[](&this->m_H,bad_face_count);
          fi0._3_1_ = *pbVar5 & 1;
          ON_SimpleArray<bool>::Append(&local_40->m_H,(bool *)((long)&fi0 + 3));
          if ((fi0._3_1_ & 1) != 0) {
            local_40->m_hidden_count = local_40->m_hidden_count + 1;
          }
        }
      }
      if (local_40->m_hidden_count < 1) {
        ON_SimpleArray<bool>::Destroy(&local_40->m_H);
        local_40->m_hidden_count = 0;
      }
      fi1 = 0;
      f.vi[3] = *(int *)((long)&(mesh_local->super_ON_Geometry).super_ON_Object.m_userdata_list + 4)
      ;
      for (f.vi[2] = *(int *)&(mesh_local->super_ON_Geometry).super_ON_Object.m_userdata_list;
          f.vi[2] < f.vi[3]; f.vi[2] = f.vi[2] + 1) {
        pOVar6 = ON_SimpleArray<ON_MeshFace>::operator[](&this->m_F,f.vi[2]);
        local_8c._0_4_ = (undefined4)*(undefined8 *)pOVar6->vi;
        local_8c._0_4_ = local_8c._0_4_ - vi;
        local_8c._4_4_ = (undefined4)((ulong)*(undefined8 *)pOVar6->vi >> 0x20);
        local_8c._4_4_ = local_8c._4_4_ - vi;
        f.vi[0] = (int)*(undefined8 *)(pOVar6->vi + 2);
        f.vi[0] = f.vi[0] - vi;
        f.vi[1] = (int)((ulong)*(undefined8 *)(pOVar6->vi + 2) >> 0x20);
        f.vi[1] = f.vi[1] - vi;
        if ((((int)local_8c._0_4_ < _bHasFaceNormals) && (-1 < (int)local_8c._0_4_)) &&
           (((int)local_8c._4_4_ < _bHasFaceNormals &&
            ((((-1 < (int)local_8c._4_4_ && (f.vi[0] < _bHasFaceNormals)) && (-1 < f.vi[0])) &&
             ((f.vi[1] < _bHasFaceNormals && (-1 < f.vi[1])))))))) {
          ON_SimpleArray<ON_MeshFace>::Append(&local_40->m_F,(ON_MeshFace *)local_8c);
          if ((submesh._4_1_ & 1) != 0) {
            pOVar3 = &local_40->m_FN;
            pOVar4 = ON_SimpleArray<ON_3fVector>::operator[]
                               (&(this->m_FN).super_ON_SimpleArray<ON_3fVector>,f.vi[2]);
            ON_SimpleArray<ON_3fVector>::Append(&pOVar3->super_ON_SimpleArray<ON_3fVector>,pOVar4);
          }
        }
        else {
          fi1 = fi1 + 1;
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
                     ,0x2e26,"","ON_Mesh::MeshPart Invalid face in partition");
        }
      }
      iVar2 = ON_SimpleArray<ON_MeshFace>::Count(&local_40->m_F);
      if ((iVar2 < 1) && (0 < fi1)) {
        if (local_40 == _submesh_F_count) {
          Destroy(_submesh_F_count);
        }
        else if (local_40 != (ON_Mesh *)0x0) {
          (*(local_40->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
        }
        local_40 = (ON_Mesh *)0x0;
      }
      this_local = local_40;
    }
  }
  return this_local;
}

Assistant:

ON_Mesh* ON_Mesh::MeshPart( 
  const ON_MeshPart& mesh_part,
  ON_Mesh* mesh 
  ) const
{
  if ( this == mesh )
  {
    ON_ERROR("ON_Mesh::MeshPart this == mesh");
    return 0;
  }

  if ( mesh )
    mesh->Destroy();

  if (    mesh_part.fi[0] < 0 
       || mesh_part.fi[1] > m_F.Count()
       || mesh_part.fi[0] > mesh_part.fi[1]
       )
  {
    ON_ERROR("ON_Mesh::MeshPart mesh_part.fi[] is not valid");
    return 0;
  }

  if (    mesh_part.vi[0] < 0
       || mesh_part.vi[1] > m_V.Count()
       || mesh_part.vi[0] >= mesh_part.vi[1]
       )
  {
    ON_ERROR("ON_Mesh::MeshPart mesh_part.vi[] is not valid");
    return 0;
  }

  const int submesh_V_count = mesh_part.vi[1] - mesh_part.vi[0];
  const int submesh_F_count = mesh_part.fi[1] - mesh_part.fi[0];

  const bool bHasVertexNormals = HasVertexNormals();
  const bool bHasTextureCoordinates = HasTextureCoordinates();
  const bool bHasVertexColors = HasVertexColors();
  const bool bHasFaceNormals = HasFaceNormals();
  const bool bHasSurfaceParameters = HasSurfaceParameters();
  const bool bHasPrincipalCurvatures = HasPrincipalCurvatures();
  const bool bHasHiddenVertices = HiddenVertexCount() > 0;

  ON_Mesh* submesh = (0 != mesh)
                   ? mesh
                   : new ON_Mesh(mesh_part.triangle_count,
                                 mesh_part.vertex_count,
                                 bHasVertexNormals,
                                 bHasTextureCoordinates
                                 );

  if ( bHasVertexColors )
    submesh->m_C.Reserve(submesh_V_count);
  if ( bHasSurfaceParameters )
    submesh->m_S.Reserve(submesh_V_count);
  if ( bHasPrincipalCurvatures )
    submesh->m_K.Reserve(submesh_V_count);
  if ( bHasHiddenVertices )
    submesh->m_H.Reserve(submesh_V_count);
  if ( bHasFaceNormals )
    submesh->m_FN.Reserve(submesh_F_count);

  // put vertex information into submesh
  const int vi0 = mesh_part.vi[0];
  const int vi1 = mesh_part.vi[1];
  for ( int vi = vi0; vi < vi1; vi++ )
  {
    submesh->m_V.Append(m_V[vi]);
    if ( bHasVertexNormals )
      submesh->m_N.Append(m_N[vi]);
    if ( bHasTextureCoordinates )
      submesh->m_T.Append(m_T[vi]);
    if ( bHasVertexColors )
      submesh->m_C.Append(m_C[vi]);
    if ( bHasSurfaceParameters )
      submesh->m_S.Append(m_S[vi]);
    if ( bHasPrincipalCurvatures )
      submesh->m_K.Append(m_K[vi]);
    if ( bHasHiddenVertices )
    {
      bool bHidden = m_H[vi];
      submesh->m_H.Append(bHidden);
      if ( bHidden )
        submesh->m_hidden_count++;
    }
  }
  if ( submesh->m_hidden_count <= 0 )
  {
    submesh->m_H.Destroy();
    submesh->m_hidden_count = 0;
  }

  // put face information into submesh
  int bad_face_count = 0;
  const int fi0 = mesh_part.fi[0];
  const int fi1 = mesh_part.fi[1];
  for ( int fi = fi0; fi < fi1; fi++ )
  {
    ON_MeshFace f = m_F[fi];
    f.vi[0] -= vi0;
    f.vi[1] -= vi0;
    f.vi[2] -= vi0;
    f.vi[3] -= vi0;
    if (    f.vi[0] >= submesh_V_count || f.vi[0] < 0 
         || f.vi[1] >= submesh_V_count || f.vi[1] < 0 
         || f.vi[2] >= submesh_V_count || f.vi[2] < 0 
         || f.vi[3] >= submesh_V_count || f.vi[3] < 0 
         )
    {
      bad_face_count++;
      ON_ERROR("ON_Mesh::MeshPart Invalid face in partition");
      continue;
    }
    submesh->m_F.Append(f);
    if ( bHasFaceNormals )
      submesh->m_FN.Append(m_FN[fi]);
  }

  if ( submesh->m_F.Count() < 1 && bad_face_count > 0 )
  {
    if ( submesh != mesh )
      delete submesh;
    else
      mesh->Destroy();

    submesh = 0;
  }

  return submesh;
}